

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O1

int QFileSystemEngine::rmdir(char *__path)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  char *b;
  char *__path_00;
  long in_FS_OFFSET;
  NativePath local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_28,(QFileSystemEntry *)__path);
  __path_00 = local_28.d.ptr;
  if ((undefined1 *)local_28.d.size != (undefined1 *)0x0) {
    pvVar2 = memchr(local_28.d.ptr,0,local_28.d.size);
    if ((long)pvVar2 - (long)__path_00 == -1 || pvVar2 == (void *)0x0) {
      if (__path_00 == (char *)0x0) {
        __path_00 = "";
      }
      iVar1 = ::rmdir(__path_00);
      iVar1 = (int)CONCAT71((int7)((ulong)__path_00 >> 8),iVar1 == 0);
      goto LAB_0013226e;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  iVar1 = 0;
LAB_0013226e:
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::rmdir(const QFileSystemEntry &entry)
{
    const QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);
    return ::rmdir(path.constData()) == 0;
}